

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt16x8OperationX86X64.cpp
# Opt level: O2

SIMDValue Js::SIMDInt16x8Operation::OpNotEqual(SIMDValue *aValue,SIMDValue *bValue)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2._0_2_ = -(ushort)((bValue->field_0).i16[0] == (aValue->field_0).i16[0]);
  auVar2._2_2_ = -(ushort)((bValue->field_0).i16[1] == (aValue->field_0).i16[1]);
  auVar2._4_2_ = -(ushort)((bValue->field_0).i16[2] == (aValue->field_0).i16[2]);
  auVar2._6_2_ = -(ushort)((bValue->field_0).i16[3] == (aValue->field_0).i16[3]);
  auVar2._8_2_ = -(ushort)((bValue->field_0).i16[4] == (aValue->field_0).i16[4]);
  auVar2._10_2_ = -(ushort)((bValue->field_0).i16[5] == (aValue->field_0).i16[5]);
  auVar2._12_2_ = -(ushort)((bValue->field_0).i16[6] == (aValue->field_0).i16[6]);
  auVar2._14_2_ = -(ushort)((bValue->field_0).i16[7] == (aValue->field_0).i16[7]);
  auVar1._8_4_ = 0xffffffff;
  auVar1._0_8_ = 0xffffffffffffffff;
  auVar1._12_4_ = 0xffffffff;
  return (SIMDValue)(anon_union_16_9_4d7543c8_for__SIMDValue_0)(auVar1 ^ auVar2);
}

Assistant:

SIMDValue SIMDInt16x8Operation::OpNotEqual(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        X86SIMDValue x86Result, tmpResult;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);
        tmpResult.m128i_value = _mm_cmpeq_epi16(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a == b?
        X86SIMDValue negativeOnes = { { -1, -1, -1, -1} };
        x86Result.m128i_value = _mm_andnot_si128(tmpResult.m128i_value, negativeOnes.m128i_value);
        return X86SIMDValue::ToSIMDValue(x86Result);
    }